

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O0

Int ipx::FindMaxAbs(Vector *x)

{
  size_t sVar1;
  valarray<double> *in_RDI;
  valarray<double> *pvVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  size_t i;
  size_t imax;
  double xmax;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 0.0;
  local_18 = 0;
  local_20 = 0;
  while( true ) {
    sVar1 = std::valarray<double>::size(in_RDI);
    if (sVar1 <= local_20) break;
    pvVar2 = in_RDI;
    std::valarray<double>::operator[](in_RDI,local_20);
    std::abs((int)pvVar2);
    if (local_10 < extraout_XMM0_Qa) {
      pvVar2 = in_RDI;
      std::valarray<double>::operator[](in_RDI,local_20);
      std::abs((int)pvVar2);
      local_18 = local_20;
      local_10 = extraout_XMM0_Qa_00;
    }
    local_20 = local_20 + 1;
  }
  return (Int)local_18;
}

Assistant:

Int FindMaxAbs(const Vector& x) {
    double xmax = 0.0;
    size_t imax = 0;
    for (size_t i = 0; i < x.size(); i++) {
        if (std::abs(x[i]) > xmax) {
            xmax = std::abs(x[i]);
            imax = i;
        }
    }
    return static_cast<Int>(imax);
}